

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EmbeddedFunctions.cpp
# Opt level: O1

bool Refal2::embeddedProut(CExecutionContext *executionContext)

{
  CNodeType *fromNode;
  CProgramPtr local_40;
  CProgramPrintHelper local_30;
  
  local_40.super___shared_ptr<Refal2::CProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (executionContext->Program).super___shared_ptr<Refal2::CProgram,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  local_40.super___shared_ptr<Refal2::CProgram,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (executionContext->Program).super___shared_ptr<Refal2::CProgram,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  if (local_40.super___shared_ptr<Refal2::CProgram,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_40.super___shared_ptr<Refal2::CProgram,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
      ->_M_use_count =
           (local_40.super___shared_ptr<Refal2::CProgram,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_40.super___shared_ptr<Refal2::CProgram,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
      ->_M_use_count =
           (local_40.super___shared_ptr<Refal2::CProgram,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
    }
  }
  CProgramPrintHelper::CProgramPrintHelper(&local_30,&local_40);
  CUnitList::StrangePrint
            (&executionContext->Argument,(ostream *)&std::cout,&local_30.super_CPrintHelper);
  local_30.super_CPrintHelper._vptr_CPrintHelper = (_func_int **)&PTR_Variable_00148a78;
  if (local_30.program.super___shared_ptr<Refal2::CProgram,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_30.program.super___shared_ptr<Refal2::CProgram,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_40.super___shared_ptr<Refal2::CProgram,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_40.super___shared_ptr<Refal2::CProgram,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
  std::ostream::put(-0x40);
  std::ostream::flush();
  fromNode = (executionContext->Argument).super_CNodeList<Refal2::CUnit>.first;
  if (fromNode != (CNodeType *)0x0) {
    CNodeList<Refal2::CUnit>::Remove
              ((CNodeList<Refal2::CUnit> *)executionContext,fromNode,
               (executionContext->Argument).super_CNodeList<Refal2::CUnit>.last);
  }
  (executionContext->Argument).super_CNodeList<Refal2::CUnit>.first = (CNodeType *)0x0;
  (executionContext->Argument).super_CNodeList<Refal2::CUnit>.last = (CNodeType *)0x0;
  return true;
}

Assistant:

static bool embeddedProut( CExecutionContext& executionContext )
{
	DEBUG_PRINT( __FUNCTION__ )
	executionContext.Argument.StrangePrint( std::cout,
		CProgramPrintHelper( executionContext.Program ) );
	std::cout << std::endl;
	executionContext.Argument.Empty();
	return true;
}